

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::findDTValidator
          (TraverseSchema *this,DOMElement *elem,XMLCh *derivedTypeName,XMLCh *baseTypeName,
          int baseRefContext)

{
  SchemaInfo **enclosingSchema;
  uint saveScope;
  SchemaInfo *toRestore;
  bool bVar1;
  uint namespaceURI;
  XMLCh *pXVar2;
  XMLCh *localPartStr;
  DatatypeValidator *pDVar3;
  SchemaInfo *toRestore_00;
  DOMElement *childElem;
  ListType aListType;
  int iVar4;
  undefined1 *msgDomain;
  
  pXVar2 = getPrefix(this,baseTypeName);
  localPartStr = getLocalPart(this,baseTypeName);
  pXVar2 = resolvePrefixToURI(this,elem,pXVar2);
  pDVar3 = getDatatypeValidator(this,pXVar2,localPartStr);
  if (pDVar3 == (DatatypeValidator *)0x0) {
    bVar1 = XMLString::equals(pXVar2,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
    if (bVar1) {
LAB_0031c3a3:
      msgDomain = XMLUni::fgXMLErrDomain;
      iVar4 = 0x28;
      baseTypeName = pXVar2;
      derivedTypeName = localPartStr;
    }
    else {
      enclosingSchema = &this->fSchemaInfo;
      toRestore = this->fSchemaInfo;
      saveScope = this->fCurrentScope;
      bVar1 = XMLString::equals(pXVar2,this->fTargetNSURIString);
      aListType = INCLUDE;
      if (((pXVar2 != (XMLCh *)0x0) && (!bVar1)) && (*pXVar2 != L'\0')) {
        namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                                 (this->fURIStringPool,pXVar2);
        bVar1 = isImportingNS(this,namespaceURI);
        if (bVar1) {
          toRestore_00 = SchemaInfo::getImportInfo(*enclosingSchema,namespaceURI);
          if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true))
          goto LAB_0031c3a3;
          restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
          aListType = IMPORT;
          goto LAB_0031c463;
        }
        iVar4 = 0x8e;
        goto LAB_0031c383;
      }
LAB_0031c463:
      childElem = SchemaInfo::getTopLevelComponent
                            (*enclosingSchema,1,(XMLCh *)SchemaSymbols::fgELT_SIMPLETYPE,
                             localPartStr,enclosingSchema);
      if (childElem != (DOMElement *)0x0) {
        pDVar3 = traverseSimpleTypeDecl(this,childElem,true,0);
        if (toRestore != this->fSchemaInfo) {
          restoreSchemaInfo(this,toRestore,aListType,saveScope);
        }
        if (pDVar3 != (DatatypeValidator *)0x0) goto LAB_0031c358;
      }
      msgDomain = XMLUni::fgValidityDomain;
      iVar4 = 0x1e;
    }
    reportSchemaError(this,elem,(XMLCh *)msgDomain,iVar4,baseTypeName,derivedTypeName,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
  else {
LAB_0031c358:
    if ((pDVar3->fFinalSet & baseRefContext) == 0) {
      return pDVar3;
    }
    iVar4 = 0x3e;
    pXVar2 = baseTypeName;
LAB_0031c383:
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar4,pXVar2,(XMLCh *)0x0,
                      (XMLCh *)0x0,(XMLCh *)0x0);
  }
  return (DatatypeValidator *)0x0;
}

Assistant:

DatatypeValidator*
TraverseSchema::findDTValidator(const DOMElement* const elem,
                                const XMLCh* const derivedTypeName,
                                const XMLCh* const baseTypeName,
                                const int baseRefContext) {

    const XMLCh*       prefix = getPrefix(baseTypeName);
    const XMLCh*       localPart = getLocalPart(baseTypeName);
    const XMLCh*       uri = resolvePrefixToURI(elem, prefix);
    DatatypeValidator* baseValidator = getDatatypeValidator(uri, localPart);

    if (baseValidator == 0) {

        // Check if the base is from the schema for schema namespace
        //
        if (XMLString::equals(uri, SchemaSymbols::fgURI_SCHEMAFORSCHEMA))
        {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
            return 0;
        }

        SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
        SchemaInfo* saveInfo = fSchemaInfo;
        unsigned int         saveScope = fCurrentScope;

        if (!XMLString::equals(uri, fTargetNSURIString) && (uri && *uri)) {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uri);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uri);
                return 0;
            }

            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uri, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }

        DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
            SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

        if (baseTypeNode != 0) {

            baseValidator = traverseSimpleTypeDecl(baseTypeNode);

            // restore schema information, if necessary
            if (saveInfo != fSchemaInfo) {
                restoreSchemaInfo(saveInfo, infoType, saveScope);
            }
        }
    }

    if (baseValidator == 0) {
        reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::UnknownBaseDatatype, baseTypeName, derivedTypeName);
    }
    else if ((baseValidator->getFinalSet() & baseRefContext) != 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DisallowedBaseDerivation, baseTypeName);
        return 0;
    }

    return baseValidator;
}